

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tile.cxx
# Opt level: O0

void __thiscall Fl_Tile::resize(Fl_Tile *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  Fl_Widget *this_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  uint local_70;
  uint local_6c;
  int B;
  int yy;
  int R;
  int xx;
  Fl_Widget *o;
  Fl_Widget **ppFStack_50;
  int i;
  Fl_Widget **a;
  int NB;
  int OB;
  int NR;
  int OR;
  int *p;
  int dh;
  int dw;
  int dy;
  int dx;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Tile *this_local;
  
  iVar3 = Fl_Widget::x((Fl_Widget *)this);
  iVar4 = Fl_Widget::y((Fl_Widget *)this);
  iVar5 = Fl_Widget::w((Fl_Widget *)this);
  iVar6 = Fl_Widget::h((Fl_Widget *)this);
  _NR = Fl_Group::sizes(&this->super_Fl_Group);
  Fl_Widget::resize((Fl_Widget *)this,X,Y,W,H);
  iVar1 = _NR[5];
  iVar7 = (X + W) - (_NR[1] - iVar1);
  iVar2 = _NR[7];
  uVar8 = (Y + H) - (_NR[3] - iVar2);
  ppFStack_50 = Fl_Group::array(&this->super_Fl_Group);
  _NR = _NR + 8;
  o._4_4_ = Fl_Group::children(&this->super_Fl_Group);
  while (o._4_4_ != 0) {
    this_00 = *ppFStack_50;
    iVar9 = Fl_Widget::x(this_00);
    yy = iVar9 + (X - iVar3);
    iVar9 = Fl_Widget::w(this_00);
    B = yy + iVar9;
    if (*_NR < iVar1) {
      if (iVar7 < yy) {
        yy = iVar7;
      }
    }
    else {
      yy = (W - iVar5) + yy;
    }
    if (_NR[1] < iVar1) {
      if (iVar7 < B) {
        B = iVar7;
      }
    }
    else {
      B = (W - iVar5) + B;
    }
    iVar9 = Fl_Widget::y(this_00);
    local_6c = iVar9 + (Y - iVar4);
    iVar9 = Fl_Widget::h(this_00);
    local_70 = local_6c + iVar9;
    piVar10 = _NR + 3;
    if (_NR[2] < iVar2) {
      if ((int)uVar8 < (int)local_6c) {
        local_6c = uVar8;
      }
    }
    else {
      local_6c = (H - iVar6) + local_6c;
    }
    _NR = _NR + 4;
    if (*piVar10 < iVar2) {
      if ((int)uVar8 < (int)local_70) {
        local_70 = uVar8;
      }
    }
    else {
      local_70 = (H - iVar6) + local_70;
    }
    (*this_00->_vptr_Fl_Widget[4])
              (this_00,(ulong)(uint)yy,(ulong)local_6c,(ulong)(uint)(B - yy),
               (ulong)(local_70 - local_6c));
    o._4_4_ = o._4_4_ + -1;
    ppFStack_50 = ppFStack_50 + 1;
  }
  return;
}

Assistant:

void Fl_Tile::resize(int X,int Y,int W,int H) {

  // remember how much to move the child widgets:
  int dx = X-x();
  int dy = Y-y();
  int dw = W-w();
  int dh = H-h();
  int *p = sizes();
  // resize this (skip the Fl_Group resize):
  Fl_Widget::resize(X,Y,W,H);

  // find bottom-right corner of resizable:
  int OR = p[5];		// old right border
  int NR = X+W-(p[1]-OR);	// new right border
  int OB = p[7];		// old bottom border
  int NB = Y+H-(p[3]-OB);	// new bottom border

  // move everything to be on correct side of new resizable:
  Fl_Widget*const* a = array();
  p += 8;
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    int xx = o->x()+dx;
    int R = xx+o->w();
    if (*p++ >= OR) xx += dw; else if (xx > NR) xx = NR;
    if (*p++ >= OR) R += dw; else if (R > NR) R = NR;
    int yy = o->y()+dy;
    int B = yy+o->h();
    if (*p++ >= OB) yy += dh; else if (yy > NB) yy = NB;
    if (*p++ >= OB) B += dh; else if (B > NB) B = NB;
    o->resize(xx,yy,R-xx,B-yy);
    // do *not* call o->redraw() here! If you do, and the tile is inside a
    // scroll, it'll set the damage areas wrong for all children!
  }
}